

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::setRootIndex(QAbstractItemView *this,QModelIndex *index)

{
  QAbstractItemViewPrivate *this_00;
  bool bVar1;
  char cVar2;
  long in_FS_OFFSET;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  char *local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  bVar1 = QModelIndex::isValid(index);
  if ((bVar1) && ((index->m).ptr != this_00->model)) {
    local_50 = 2;
    uStack_40._4_4_ = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    uStack_40._0_4_ = 0;
    local_38 = "default";
    QMessageLogger::warning
              ((char *)&local_50,
               "QAbstractItemView::setRootIndex failed : index must be from the currently set model"
              );
  }
  else {
    QPersistentModelIndex::operator=(&this_00->root,index);
    cVar2 = QAccessible::isActive();
    if (cVar2 != '\0') {
      uStack_44 = 0xaaaaaaaa;
      local_38 = (char *)0xffffffff;
      local_50 = 0x80b168;
      uStack_4c = 0;
      local_30 = 0xffffffff;
      uStack_2c = 0xffffffff;
      uStack_28 = 0xffffffff;
      uStack_24 = 0xffffffff;
      uStack_48 = 0x116;
      uStack_40 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
                ((QAccessibleTableModelChangeEvent *)&local_50);
    }
    QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,0);
    QAbstractItemViewPrivate::updateGeometry(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::setRootIndex(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (Q_UNLIKELY(index.isValid() && index.model() != d->model)) {
        qWarning("QAbstractItemView::setRootIndex failed : index must be from the currently set model");
        return;
    }
    d->root = index;
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(this, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    d->doDelayedItemsLayout();
    d->updateGeometry();
}